

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O2

void __thiscall
QPixmapStyle::drawPrimitive
          (QPixmapStyle *this,PrimitiveElement element,QStyleOption *option,QPainter *painter,
          QWidget *widget)

{
  QTextEdit *pQVar1;
  QListView *pQVar2;
  uint *puVar3;
  
  puVar3 = &switchD_003313a3::switchdataD_005eea60;
  switch(element) {
  case PE_Frame:
  case PE_FrameDefaultButton:
    pQVar1 = QtPrivate::qobject_cast_helper<QTextEdit_const*,QObject_const>(&widget->super_QObject);
    if (pQVar1 != (QTextEdit *)0x0) {
      drawTextEdit(this,option,painter,(QWidget *)puVar3);
      return;
    }
  case PE_FrameFocusRect:
    return;
  case PE_FrameDockWidget:
  case PE_FrameGroupBox:
  case PE_FrameMenu:
  case PE_FrameStatusBarItem:
  case PE_FrameTabWidget:
  case PE_FrameWindow:
  case PE_FrameButtonBevel:
  case PE_FrameButtonTool:
  case PE_FrameTabBarBase:
    goto switchD_003313a3_caseD_2;
  case PE_FrameLineEdit:
switchD_003313a3_caseD_5:
    drawLineEdit(this,option,painter,widget);
    return;
  case PE_PanelButtonCommand:
  case PE_PanelButtonBevel:
    drawPushButton(this,option,painter,(QWidget *)&switchD_003313a3::switchdataD_005eea60);
    return;
  default:
    if (element == PE_PanelLineEdit) goto switchD_003313a3_caseD_5;
    if (element == PE_IndicatorCheckBox) {
      drawCheckBox(this,option,painter,(QWidget *)painter);
      return;
    }
    if (element == PE_IndicatorRadioButton) {
      drawRadioButton(this,option,painter,(QWidget *)painter);
      return;
    }
    if (element == PE_PanelItemViewItem) {
      pQVar2 = QtPrivate::qobject_cast_helper<QListView_const*,QObject_const>
                         (&widget->super_QObject);
      if (pQVar2 != (QListView *)0x0) {
        drawPanelItemViewItem(this,option,painter,widget);
        return;
      }
      element = PE_PanelItemViewItem;
    }
switchD_003313a3_caseD_2:
    QCommonStyle::drawPrimitive(&this->super_QCommonStyle,element,option,painter,widget);
    return;
  }
}

Assistant:

void QPixmapStyle::drawPrimitive(PrimitiveElement element, const QStyleOption *option,
                                 QPainter *painter, const QWidget *widget) const
{
    switch (element) {
    case PE_FrameFocusRect: //disable focus rectangle
        break;
    case PE_PanelButtonBevel:
    case PE_PanelButtonCommand:
        drawPushButton(option, painter, widget);
        break;
    case PE_PanelLineEdit:
    case PE_FrameLineEdit:
        drawLineEdit(option, painter, widget);
        break;
    case PE_Frame:
#if QT_CONFIG(textedit)
    case PE_FrameDefaultButton:
        if (qobject_cast<const QTextEdit*>(widget))
            drawTextEdit(option, painter, widget);
        break;
#endif
    case PE_IndicatorCheckBox:
        drawCheckBox(option, painter, widget);
        break;
    case PE_IndicatorRadioButton:
        drawRadioButton(option, painter, widget);
        break;
    case PE_PanelItemViewItem:
#if QT_CONFIG(listview)
        if (qobject_cast<const QListView*>(widget))
            drawPanelItemViewItem(option, painter, widget);
        else
#endif
            QCommonStyle::drawPrimitive(element, option, painter, widget);
        break;
    default:
        QCommonStyle::drawPrimitive(element, option, painter, widget);
    }
}